

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegisterTest_test_comparator_with_messed_up_subjects_Test
::~SubjectSetRegisterTest_test_comparator_with_messed_up_subjects_Test
          (SubjectSetRegisterTest_test_comparator_with_messed_up_subjects_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_comparator_with_messed_up_subjects)
{
    Subject s1 = SubjectUtils::CreateSubjectFromString("Account=DYMONCITI,Currency=EUR,Exchange=OTC");
    Subject s2 = SubjectUtils::CreateSubjectFromString("AllocAccount=DYMONCITI,Currency=EUR");
    Subject s3 = SubjectUtils::CreateSubjectFromString("Account=DYMONCITI,Currency=EUR,Exchange=OTC,Quantity=2000000.00");
    Subject s4 = SubjectUtils::CreateSubjectFromString("Symbol=EURCHF,Quantity=500000.00");
    Subject s5 = SubjectUtils::CreateSubjectFromString("Currency=EUR,Symbol=EURCHF,Quantity=2000000.00");
    Subject s6 = SubjectUtils::CreateSubjectFromString("Symbol=EURCHF,Quantity=2000000.00");
    Subject s7 = SubjectUtils::CreateSubjectFromString("Quantity=1230000.00,Symbol=EURGBP");
    Subject s8 = SubjectUtils::CreateSubjectFromString("Symbol=EURGBP,Quantity=1230000.00");
    Subject s9 = SubjectUtils::CreateSubjectFromString("Symbol=EURGBP,Quantity=5000000.00");
    Subject s10 = SubjectUtils::CreateSubjectFromString("Symbol=USDJPY,Account=DYMONCITI");

    std::vector<Subject> original_input = {s1, s2, s3, s4, s5, s6, s7, s9, s10};
    std::vector<Subject> shuffle_input = {s1, s2, s3, s4, s5, s6, s7, s8, s9, s10};
    auto rng = std::default_random_engine {};

    for (int i = 0; i < 100; i++)
    {
        SubjectSetRegister subject_register = SubjectSetRegister();
        std::shuffle(std::begin(shuffle_input), std::end(shuffle_input), rng);

        for (Subject subject : shuffle_input)
        {
            subject_register.Register(subject, false);
        }

        std::vector<Subject> output = subject_register.NextSubscriptionSync()->GetSubjects();

        EXPECT_EQ(original_input.size(), output.size());

        for (size_t j = 0; j < original_input.size(); j++)
        {
            EXPECT_EQ(original_input[j], output[j]);
        }
    }
}